

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O0

int compute_set_matrix_2d(int set,float *azimuth,vbap_data *data)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  float inv_det;
  float det;
  float x4;
  float x3;
  float x2;
  float x1;
  int j;
  int i;
  vbap_data *data_local;
  float *azimuth_local;
  int set_local;
  
  uVar2 = (uint)data->sets[set].speakers[0];
  uVar3 = (uint)data->sets[set].speakers[1];
  dVar5 = cos(((double)azimuth[(int)uVar2] * 6.283185307179586) / 360.0);
  dVar6 = sin(((double)azimuth[(int)uVar2] * 6.283185307179586) / 360.0);
  dVar7 = cos(((double)azimuth[(int)uVar3] * 6.283185307179586) / 360.0);
  dVar8 = sin(((double)azimuth[(int)uVar3] * 6.283185307179586) / 360.0);
  fVar4 = (float)dVar5 * (float)dVar8 + -((float)dVar7 * (float)dVar6);
  memset(data->sets[set].inv_mat,0,0x24);
  bVar1 = 0.001 < ABS(fVar4);
  if (bVar1) {
    fVar4 = 1.0 / fVar4;
    data->sets[set].inv_mat[0] = (float)dVar8 * fVar4;
    data->sets[set].inv_mat[2] = (float)dVar7 * -fVar4;
    data->sets[set].inv_mat[3] = (float)dVar6 * -fVar4;
    data->sets[set].inv_mat[5] = (float)dVar5 * fVar4;
  }
  azimuth_local._4_4_ = (uint)bVar1;
  return azimuth_local._4_4_;
}

Assistant:

int compute_set_matrix_2d(int set, float azimuth[], struct vbap_data *data){
  int i = data->sets[set].speakers[0];
  int j = data->sets[set].speakers[1];
  // TODO: I feel like it would be better to extract these from
  //       the positions instead of doing more trig, but I'll
  //       leave that for when it's actually tested.
  float x1 = cos(azimuth[i] * DEG2RAD);
  float x2 = sin(azimuth[i] * DEG2RAD);
  float x3 = cos(azimuth[j] * DEG2RAD);
  float x4 = sin(azimuth[j] * DEG2RAD);
  float det = (x1 * x4 - x3 * x2);

  memset(data->sets[set].inv_mat, 0, sizeof(float)*9);
  if(fabsf(det) <= 0.001){
    return 0;
  }
  
  float inv_det = 1.0 / det;
  // The matrix is constructed in such a way that the Y component of the input
  // vector is zeroed on multiplication. The matrix is in row-major format.
  data->sets[set].inv_mat[0] = x4 * +inv_det;
  data->sets[set].inv_mat[2] = x3 * -inv_det;
  data->sets[set].inv_mat[3] = x2 * -inv_det;
  data->sets[set].inv_mat[5] = x1 * +inv_det;
  return 1;
}